

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

int stbir__edge_reflect_full(int n,int max)

{
  int max2;
  int max_local;
  int n_local;
  
  if (n < 0) {
    if (n == -max || SBORROW4(n,-max) != n + max < 0) {
      max_local = max + -1;
    }
    else {
      max_local = -n;
    }
  }
  else {
    max_local = n;
    if (max <= n) {
      if (n < max * 2) {
        max_local = (max * 2 - n) + -1;
      }
      else {
        max_local = 0;
      }
    }
  }
  return max_local;
}

Assistant:

static int stbir__edge_reflect_full( int n, int max )
{
  if (n < 0)
  {
    if (n > -max)
      return -n;
    else
      return max - 1;
  }

  if (n >= max)
  {
    int max2 = max * 2;
    if (n >= max2)
      return 0;
    else
      return max2 - n - 1;
  }

  return n; // NOTREACHED
}